

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::SetProperty
          (TypedArrayBase *this,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  bool bVar1;
  uint32 uVar2;
  BOOL BVar3;
  ScriptContext *this_00;
  PropertyRecord *this_01;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  PropertyOperationFlags flags_local;
  Var value_local;
  PropertyId propertyId_local;
  TypedArrayBase *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
  bVar1 = PropertyRecord::IsNumeric(this_01);
  if (bVar1) {
    uVar2 = PropertyRecord::GetNumericValue(this_01);
    (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
              (this,(ulong)uVar2,value);
    this_local._4_4_ = 1;
  }
  else {
    bVar1 = PropertyRecord::IsSymbol(this_01);
    if ((!bVar1) && (BVar3 = CanonicalNumericIndexString(propertyId,this_00), BVar3 != 0)) {
      return 0;
    }
    this_local._4_4_ = DynamicObject::SetProperty((DynamicObject *)this,propertyId,value,flags,info)
    ;
  }
  return this_local._4_4_;
}

Assistant:

BOOL TypedArrayBase::SetProperty(PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        ScriptContext *scriptContext = GetScriptContext();

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            this->DirectSetItem(propertyRecord->GetNumericValue(), value);
            return true;
        }

        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return FALSE;
        }
        else
        {
            return DynamicObject::SetProperty(propertyId, value, flags, info);
        }
    }